

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_2str.c
# Opt level: O0

char * strof_profle(MppCodingType coding,RK_U32 profile)

{
  RK_U32 profile_local;
  MppCodingType coding_local;
  
  if (coding == MPP_VIDEO_CodingAVC) {
    if (profile == 0x42) {
      _profile_local = strof_profle::h264_profile_str[0];
    }
    else if (profile == 0x4d) {
      _profile_local = strof_profle::h264_profile_str[1];
    }
    else if (profile == 100) {
      _profile_local = strof_profle::h264_profile_str[2];
    }
    else if (profile == 0x6e) {
      _profile_local = strof_profle::h264_profile_str[3];
    }
    else {
      _profile_local = strof_profle::unknown_str[0];
    }
  }
  else if (coding == MPP_VIDEO_CodingMJPEG) {
    _profile_local = strof_profle::jpeg_profile_str[0];
  }
  else if (coding == MPP_VIDEO_CodingVP8) {
    _profile_local = strof_profle::vp8_profile_str[0];
  }
  else if (coding == MPP_VIDEO_CodingHEVC) {
    if (profile < 2) {
      _profile_local = strof_profle::h265_profile_str[0];
    }
    else {
      _profile_local = strof_profle::unknown_str[0];
    }
  }
  else {
    _profile_local = (char *)0x0;
  }
  return _profile_local;
}

Assistant:

const char *strof_profle(MppCodingType coding, RK_U32 profile)
{
    static const char *h264_profile_str[] = {
        "baseline",
        "main",
        "high",
        "high10",
    };
    static const char *h265_profile_str[] = {
        "main",
        "main10",
    };
    static const char *jpeg_profile_str[] = {
        "base",
    };
    static const char *vp8_profile_str[] = {
        "base",
    };
    static const char *unknown_str[] = {
        "unknown",
    };

    switch (coding) {
    case MPP_VIDEO_CodingAVC : {
        if (profile == H264_PROFILE_BASELINE)
            return h264_profile_str[0];
        else if (profile == H264_PROFILE_MAIN)
            return h264_profile_str[1];
        else if (profile == H264_PROFILE_HIGH)
            return h264_profile_str[2];
        else if (profile == H264_PROFILE_HIGH10)
            return h264_profile_str[3];
        else
            return unknown_str[0];
    } break;
    case MPP_VIDEO_CodingHEVC : {
        if (profile < 2)
            return h265_profile_str[0];
        else
            return unknown_str[0];
    } break;
    case MPP_VIDEO_CodingMJPEG : {
        return jpeg_profile_str[0];
    } break;
    case MPP_VIDEO_CodingVP8 : {
        return vp8_profile_str[0];
    } break;
    default : {
    } break;
    }

    return NULL;
}